

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

void wabt::anon_unknown_1::ResolveTypeName
               (Module *module,Type *type,Index index,
               unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *bindings)

{
  Index IVar1;
  const_iterator cVar2;
  Index local_1c;
  
  if (type->enum_ == Reference) {
    local_1c = index;
    IVar1 = Type::GetReferenceIndex(type);
    if (IVar1 == 0xffffffff) {
      cVar2 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&bindings->_M_h,&local_1c);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("name_iterator != bindings.cend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0x144,
                      "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                     );
      }
      IVar1 = BindingHash::FindIndex
                        (&module->type_bindings,
                         (string *)
                         ((long)cVar2.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ._M_cur + 0x10));
      if (IVar1 == 0xffffffff) {
        __assert_fail("type_index != kInvalidIndex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                      ,0x146,
                      "void wabt::(anonymous namespace)::ResolveTypeName(const Module &, Type &, Index, const std::unordered_map<uint32_t, std::string> &)"
                     );
      }
      *type = (Type)((ulong)IVar1 << 0x20 | 0xffffffeb);
    }
  }
  return;
}

Assistant:

void ResolveTypeName(
    const Module& module,
    Type& type,
    Index index,
    const std::unordered_map<uint32_t, std::string>& bindings) {
  if (type != Type::Reference || type.GetReferenceIndex() != kInvalidIndex) {
    return;
  }

  const auto name_iterator = bindings.find(index);
  assert(name_iterator != bindings.cend());
  const auto type_index = module.type_bindings.FindIndex(name_iterator->second);
  assert(type_index != kInvalidIndex);
  type = Type(Type::Reference, type_index);
}